

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerNewRegEx(Lowerer *this,Instr *instr)

{
  ScriptContextInfo *pSVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  DWORD DVar9;
  Opnd *pOVar10;
  undefined4 *puVar11;
  Instr *pIVar12;
  RegOpnd *dstOpnd;
  JITTimeFunctionBody *pJVar13;
  FunctionJITTimeInfo *pFVar14;
  undefined4 extraout_var;
  AddrOpnd *pAVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  IndirOpnd *pIVar16;
  LabelInstr *pLVar17;
  IndirOpnd *local_58;
  SymOpnd *tempObjectSymOpnd;
  Opnd *local_48;
  IndirOpnd *local_40;
  bool local_31;
  
  pOVar10 = IR::Instr::UnlinkSrc1(instr);
  OVar3 = IR::Opnd::GetKind(pOVar10);
  if (OVar3 != OpndKindAddr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2f14,"(src1->IsAddrOpnd())","src1->IsAddrOpnd()");
    if (!bVar4) goto LAB_005ac8fe;
    *puVar11 = 0;
  }
  if (DAT_015d3478 == '\x01') {
    if ((instr->m_dst->field_0xb & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2f19,"(!instr->GetDst()->CanStoreTemp())",
                         "!instr->GetDst()->CanStoreTemp()");
      if (!bVar4) goto LAB_005ac8fe;
      *puVar11 = 0;
    }
    LoadScriptContext(this,instr);
    pIVar12 = LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar10);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr,HelperScrRegEx_OP_NewRegEx,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,false);
    return pIVar12;
  }
  tempObjectSymOpnd = (SymOpnd *)instr->m_prev;
  dstOpnd = (RegOpnd *)IR::Instr::UnlinkDst(instr);
  OVar3 = IR::Opnd::GetKind((Opnd *)dstOpnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) {
LAB_005ac8fe:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar11 = 0;
  }
  local_31 = GenerateRecyclerOrMarkTempAlloc
                       (this,instr,dstOpnd,HelperAllocMemForJavascriptRegExp,0x40,
                        (SymOpnd **)&local_58);
  local_40 = local_58;
  local_48 = pOVar10;
  if (local_58 == (IndirOpnd *)0x0) {
LAB_005ac703:
    pSVar1 = instr->m_func->m_scriptContextInfo;
    iVar8 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,0x23);
    pAVar15 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var_00,iVar8),AddrOpndKindDynamicVtable,
                                this->m_func,false,(Var)0x0);
    pIVar16 = IR::IndirOpnd::New(dstOpnd,0,(pAVar15->super_Opnd).m_type,this->m_func,false);
    bVar4 = true;
    pLVar17 = (LabelInstr *)instr;
  }
  else {
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,HoistMarkTempInitPhase,uVar6,uVar7);
    if ((bVar4) || (this->outerMostLoopLabel == (LabelInstr *)0x0)) goto LAB_005ac703;
    pSVar1 = ((this->outerMostLoopLabel->super_Instr).m_func)->m_scriptContextInfo;
    iVar8 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,0x23);
    pAVar15 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var,iVar8),AddrOpndKindDynamicVtable,
                                this->m_func,false,(Var)0x0);
    bVar4 = false;
    pLVar17 = this->outerMostLoopLabel;
    pIVar16 = local_40;
  }
  InsertMove(&pIVar16->super_Opnd,&pAVar15->super_Opnd,&pLVar17->super_Instr,bVar4);
  DVar9 = Js::DynamicObject::GetOffsetOfType();
  iVar8 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0xc])();
  pAVar15 = IR::AddrOpnd::New(CONCAT44(extraout_var_01,iVar8),AddrOpndKindDynamicType,instr->m_func,
                              false,(Var)0x0);
  pIVar16 = IR::IndirOpnd::New(dstOpnd,DVar9,(pAVar15->super_Opnd).m_type,this->m_func,false);
  InsertMove(&pIVar16->super_Opnd,&pAVar15->super_Opnd,instr,true);
  DVar9 = Js::DynamicObject::GetOffsetOfAuxSlots();
  bVar4 = local_31;
  GenerateMemInitNull(this,dstOpnd,DVar9,instr,local_31);
  DVar9 = Js::DynamicObject::GetOffsetOfObjectArray();
  GenerateMemInitNull(this,dstOpnd,DVar9,instr,bVar4);
  if (local_40 != (IndirOpnd *)0x0) {
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,HoistMarkTempInitPhase,uVar6,uVar7);
    if ((!bVar5) && (this->outerMostLoopLabel != (LabelInstr *)0x0)) {
      pIVar16 = (IndirOpnd *)
                IR::SymOpnd::New((Sym *)local_40->m_baseOpnd,*(int *)&local_40->m_indexOpnd + 0x20,
                                 TyUint64,this->m_func);
      bVar5 = false;
      pLVar17 = this->outerMostLoopLabel;
      pOVar10 = local_48;
      goto LAB_005ac89a;
    }
  }
  pOVar10 = local_48;
  pIVar16 = IR::IndirOpnd::New(dstOpnd,0x20,local_48->m_type,this->m_func,false);
  bVar5 = true;
  pLVar17 = (LabelInstr *)instr;
LAB_005ac89a:
  InsertMove(&pIVar16->super_Opnd,pOVar10,&pLVar17->super_Instr,bVar5);
  GenerateMemInitNull(this,dstOpnd,0x28,instr,bVar4);
  GenerateMemInitNull(this,dstOpnd,0x30,instr,bVar4);
  GenerateMemInit(this,dstOpnd,0x38,0,instr,bVar4);
  IR::Instr::Remove(instr);
  return (Instr *)tempObjectSymOpnd;
}

Assistant:

IR::Instr *
Lowerer::LowerNewRegEx(IR::Instr * instr)
{
    IR::Opnd *src1 = instr->UnlinkSrc1();

    Assert(src1->IsAddrOpnd());

#if ENABLE_REGEX_CONFIG_OPTIONS
    if (REGEX_CONFIG_FLAG(RegexTracing))
    {
        Assert(!instr->GetDst()->CanStoreTemp());
        IR::Instr * instrPrev = LoadScriptContext(instr);
        instrPrev = m_lowererMD.LoadHelperArgument(instr, src1);
        m_lowererMD.ChangeToHelperCall(instr, IR::HelperScrRegEx_OP_NewRegEx);
        return instrPrev;
    }
#endif
    IR::Instr * instrPrev = instr->m_prev;
    IR::RegOpnd * dstOpnd = instr->UnlinkDst()->AsRegOpnd();
    IR::SymOpnd * tempObjectSymOpnd;
    bool isZeroed = GenerateRecyclerOrMarkTempAlloc(instr, dstOpnd, IR::HelperAllocMemForJavascriptRegExp, sizeof(Js::JavascriptRegExp), &tempObjectSymOpnd);
    if (tempObjectSymOpnd && !PHASE_OFF(Js::HoistMarkTempInitPhase, this->m_func) && this->outerMostLoopLabel)
    {
        // Hoist the vtable and pattern init to the outer most loop top as it never changes
        InsertMove(tempObjectSymOpnd,
            LoadVTableValueOpnd(this->outerMostLoopLabel, VTableValue::VtableJavascriptRegExp),
            this->outerMostLoopLabel, false);
    }
    else
    {
        GenerateMemInit(dstOpnd, 0, LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp), instr, isZeroed);
    }
    GenerateMemInit(dstOpnd, Js::JavascriptRegExp::GetOffsetOfType(),
        this->LoadLibraryValueOpnd(instr, LibraryValue::ValueRegexType), instr, isZeroed);
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfAuxSlots(), instr, isZeroed);
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfObjectArray(), instr, isZeroed);
    if (tempObjectSymOpnd && !PHASE_OFF(Js::HoistMarkTempInitPhase, this->m_func) && this->outerMostLoopLabel)
    {
        InsertMove(IR::SymOpnd::New(tempObjectSymOpnd->m_sym,
            tempObjectSymOpnd->m_offset + Js::JavascriptRegExp::GetOffsetOfPattern(), TyMachPtr, this->m_func),
            src1, this->outerMostLoopLabel, false);
    }
    else
    {
        GenerateMemInit(dstOpnd, Js::JavascriptRegExp::GetOffsetOfPattern(), src1, instr, isZeroed);
    }
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfSplitPattern(), instr, isZeroed);
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexVar(), instr, isZeroed);
    GenerateMemInit(dstOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag(), 0, instr, isZeroed);
    instr->Remove();

    return instrPrev;
}